

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O2

size_t Curl_cwriter_count(Curl_easy *data,Curl_cwriter_phase phase)

{
  Curl_cwriter *pCVar1;
  size_t sVar2;
  Curl_cwriter **ppCVar3;
  
  sVar2 = 0;
  ppCVar3 = &(data->req).writer_stack;
  while (pCVar1 = *ppCVar3, pCVar1 != (Curl_cwriter *)0x0) {
    sVar2 = sVar2 + (pCVar1->phase == phase);
    ppCVar3 = &pCVar1->next;
  }
  return sVar2;
}

Assistant:

size_t Curl_cwriter_count(struct Curl_easy *data, Curl_cwriter_phase phase)
{
  struct Curl_cwriter *w;
  size_t n = 0;

  for(w = data->req.writer_stack; w; w = w->next) {
    if(w->phase == phase)
      ++n;
  }
  return n;
}